

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_CodePrinter.h
# Opt level: O0

void __thiscall choc::text::CodePrinter::Indent::~Indent(Indent *this)

{
  Indent *this_local;
  
  addIndent(this->owner,-this->amount);
  if (this->closeBrace != '\0') {
    CodePrinter::operator<<(this->owner,this->closeBrace);
  }
  return;
}

Assistant:

~Indent()
    {
        owner.addIndent (-amount);

        if (closeBrace != 0)
            owner << closeBrace;
    }